

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Instance::Mark(Instance *this,Store *store)

{
  ulong uVar1;
  _Bit_type *p_Var2;
  pointer pRVar3;
  pointer pEVar4;
  ulong uVar5;
  pointer pEVar6;
  Ref *ref_7;
  pointer pRVar7;
  
  uVar1 = (this->module_).index;
  p_Var2 = (store->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar5 = uVar1 + 0x3f;
  if (-1 < (long)uVar1) {
    uVar5 = uVar1;
  }
  p_Var2[((long)uVar5 >> 6) +
         (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
       p_Var2[((long)uVar5 >> 6) +
              (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
       1L << ((byte)uVar1 & 0x3f);
  pRVar3 = (this->imports_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->imports_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pRVar3 = (this->funcs_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pRVar3 = (this->memories_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pRVar3 = (this->tables_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pRVar3 = (this->globals_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pRVar3 = (this->events_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->events_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pRVar3 = (this->exports_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar7 = (this->exports_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    uVar1 = pRVar7->index;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    p_Var2[((long)uVar5 >> 6) +
           (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)uVar5 >> 6) +
                (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << ((byte)uVar1 & 0x3f);
  }
  pEVar4 = (this->elems_).
           super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar6 = (this->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar6 != pEVar4; pEVar6 = pEVar6 + 1) {
    pRVar3 = (pEVar6->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar7 = (pEVar6->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
      uVar1 = pRVar7->index;
      uVar5 = uVar1 + 0x3f;
      if (-1 < (long)uVar1) {
        uVar5 = uVar1;
      }
      p_Var2[((long)uVar5 >> 6) +
             (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
           p_Var2[((long)uVar5 >> 6) +
                  (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
           1L << ((byte)uVar1 & 0x3f);
    }
  }
  return;
}

Assistant:

void Instance::Mark(Store& store) {
  store.Mark(module_);
  store.Mark(imports_);
  store.Mark(funcs_);
  store.Mark(memories_);
  store.Mark(tables_);
  store.Mark(globals_);
  store.Mark(events_);
  store.Mark(exports_);
  for (auto&& elem : elems_) {
    elem.Mark(store);
  }
}